

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::~PageAllocatorBase
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  this->_vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_01376258;
  bVar2 = ValidThreadAccess(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x2ec,"(this->ValidThreadAccess())",
                       "Page allocator tear-down should only happen on the owning thread");
    if (!bVar2) goto LAB_0066faec;
    *puVar4 = 0;
  }
  iVar3 = (*this->_vptr_PageAllocatorBase[3])(this);
  if ((char)iVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x2ef,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar2) {
LAB_0066faec:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SubUsedBytes(this,this->usedBytes);
  this->reservedBytes = 0;
  this->committedBytes = 0;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  Clear<Memory::NoThrowHeapAllocator>
            (&this->segments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  Clear<Memory::NoThrowHeapAllocator>
            (&this->fullSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  Clear<Memory::NoThrowHeapAllocator>
            (&this->emptySegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  Clear<Memory::NoThrowHeapAllocator>
            (&this->decommitSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  Clear<Memory::NoThrowHeapAllocator>
            (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  PageTracking::PageAllocatorDestroyed((PageAllocator *)this);
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::~DListBase
            (&this->largeSegments);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::~DListBase
            (&this->decommitSegments);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::~DListBase
            (&this->emptySegments);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::~DListBase
            (&this->fullSegments);
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::~DListBase
            (&this->segments);
  return;
}

Assistant:

PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::~PageAllocatorBase()
{
    AssertMsg(this->ValidThreadAccess(), "Page allocator tear-down should only happen on the owning thread");

#if DBG
    Assert(!this->HasMultiThreadAccess());
#endif

    SubUsedBytes(usedBytes);

    SubCommittedBytes(committedBytes);
    SubReservedBytes(reservedBytes);

    ReleaseSegmentList(&segments);
    ReleaseSegmentList(&fullSegments);
    ReleaseSegmentList(&emptySegments);
    ReleaseSegmentList(&decommitSegments);
    ReleaseSegmentList(&largeSegments);

    PageTracking::PageAllocatorDestroyed((PageAllocator*)this);
}